

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O0

void pusht_bfr(Btor2Parser *bfr,Btor2Line *l)

{
  long lVar1;
  size_t size;
  void *pvVar2;
  void *in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x20) <= *(long *)(in_RDI + 0x28)) {
    if (*(long *)(in_RDI + 0x20) == 0) {
      size = 1;
    }
    else {
      size = *(long *)(in_RDI + 0x20) << 1;
    }
    *(size_t *)(in_RDI + 0x20) = size;
    pvVar2 = btor2parser_realloc(in_RSI,size);
    *(void **)(in_RDI + 8) = pvVar2;
  }
  lVar1 = *(long *)(in_RDI + 0x28);
  *(long *)(in_RDI + 0x28) = lVar1 + 1;
  *(void **)(*(long *)(in_RDI + 8) + lVar1 * 8) = in_RSI;
  return;
}

Assistant:

static void
pusht_bfr (Btor2Parser *bfr, Btor2Line *l)
{
  if (bfr->ntable >= bfr->sztable)
  {
    bfr->sztable = bfr->sztable ? 2 * bfr->sztable : 1;
    bfr->table =
        btor2parser_realloc (bfr->table, bfr->sztable * sizeof *bfr->table);
  }
  bfr->table[bfr->ntable++] = l;
}